

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O1

void INT_CMCondition_set_client_data(CManager cm,int condition,void *client_data)

{
  CMCondition p_Var1;
  
  p_Var1 = (CMCondition)&cm->control_list->condition_list;
  set_debug_flag(cm);
  do {
    p_Var1 = p_Var1->next;
    if (p_Var1 == (CMCondition)0x0) {
      p_Var1 = (CMCondition)0x0;
      fprintf(_stderr,"Serious internal error.  Use of condition %d, no longer in control list\n",
              condition);
      break;
    }
  } while (p_Var1->condition_num != condition);
  if (p_Var1 != (CMCondition)0x0) {
    p_Var1->client_data = client_data;
  }
  return;
}

Assistant:

extern void
INT_CMCondition_set_client_data(CManager cm, int condition, void *client_data)
{
    CMCondition cond;
    CMControlList cl = cm->control_list;
    set_debug_flag(cm);
    cond = CMCondition_find(cl, condition);
    if (!cond) return;
    cond->client_data = client_data;
}